

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::mulbaseappr(BN *this,bt *multiplier)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference puVar4;
  unsigned_short *i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  bt *pbStack_20;
  bt2 curr;
  bt *multiplier_local;
  BN *this_local;
  
  pbStack_20 = multiplier;
  multiplier_local = (bt *)this;
  if (*multiplier == 0) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,1);
    pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::front(&this->ba);
    *pvVar3 = 0;
  }
  else {
    __range1._4_4_ = 0;
    __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->ba);
    i = (unsigned_short *)
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->ba);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                       *)&i), bVar1) {
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end1);
      uVar2 = (uint)*puVar4 * (uint)*pbStack_20 + __range1._4_4_;
      *puVar4 = (unsigned_short)uVar2;
      __range1._4_4_ = uVar2 >> 0x10;
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end1);
    }
    if (__range1._4_4_ != 0) {
      std::vector<unsigned_short,std::allocator<unsigned_short>>::emplace_back<unsigned_int&>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,
                 (uint *)((long)&__range1 + 4));
    }
  }
  return this;
}

Assistant:

BN& BN::mulbaseappr(const bt &multiplier)
{
    if (!multiplier) {
        ba.resize(1);
        ba.front() = 0;
        return *this;
    }

    bt2 curr = 0;
    for(auto& i : ba) {
        i = curr += static_cast<bt2>(i) * multiplier;
        curr >>= bz8;
    }
    if (curr)
        ba.emplace_back(curr);
    return *this;
}